

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O1

void gvr::anon_unknown_3::readASCIIElement(streambuf *in,char *out,int n)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  
  if (*(byte **)(in + 0x10) < *(byte **)(in + 0x18)) {
    uVar2 = (uint)**(byte **)(in + 0x10);
  }
  else {
    uVar2 = (**(code **)(*(long *)in + 0x48))(in);
  }
  while ((uVar2 != 0xffffffff && (iVar1 = isspace(uVar2), iVar1 != 0))) {
    uVar2 = std::streambuf::snextc();
  }
  uVar4 = 0;
  if (uVar2 != 0xffffffff) {
    do {
      iVar3 = (int)uVar4;
      iVar1 = isspace(uVar2);
      if (iVar1 != 0) break;
      if (iVar3 < 0x27) {
        uVar4 = (ulong)(iVar3 + 1);
        out[iVar3] = (char)uVar2;
      }
      iVar3 = (int)uVar4;
      uVar2 = std::streambuf::snextc();
    } while (uVar2 != 0xffffffff);
    uVar4 = (ulong)iVar3;
  }
  out[uVar4] = '\0';
  return;
}

Assistant:

void readASCIIElement(std::streambuf *in, char *out, int n)
{
  // eat white spaces

  int c=in->sgetc();

  while (c != EOF && isspace(c))
  {
    c=in->snextc();
  }

  // read until next white space or end of file

  n--;
  int i=0;

  while (c != EOF && !isspace(c))
  {
    if (i < n)
    {
      out[i++]=static_cast<char>(c);
    }

    c=in->snextc();
  }

  out[i]='\0';
}